

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O3

int __thiscall gvr::PLYWriter::open(PLYWriter *this,char *__file,int __oflag,...)

{
  ofstream *poVar1;
  PLYElement *pPVar2;
  pointer pPVar3;
  pointer pcVar4;
  long lVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  pointer ppPVar9;
  pointer ppPVar10;
  pointer this_00;
  ulong uVar11;
  
  if (__oflag == 1) {
    bVar6 = gutil::isMSBFirst();
    __oflag = bVar6 ^ ply_little_endian;
  }
  this->enc = __oflag;
  ppPVar9 = (this->list).super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppPVar10 = (this->list).super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppPVar10 != ppPVar9) {
    uVar11 = 0;
    do {
      pPVar2 = ppPVar9[uVar11];
      if (pPVar2 != (PLYElement *)0x0) {
        this_00 = (pPVar2->list).
                  super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pPVar3 = (pPVar2->list).
                 super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (this_00 != pPVar3) {
          do {
            anon_unknown_3::PLYProperty::~PLYProperty(this_00);
            this_00 = this_00 + 1;
          } while (this_00 != pPVar3);
          this_00 = (pPVar2->list).
                    super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        if (this_00 != (pointer)0x0) {
          operator_delete(this_00);
        }
        pcVar4 = (pPVar2->name)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar4 != &(pPVar2->name).field_2) {
          operator_delete(pcVar4);
        }
      }
      operator_delete(pPVar2);
      uVar11 = uVar11 + 1;
      ppPVar9 = (this->list).
                super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppPVar10 = (this->list).
                 super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    } while (uVar11 < (ulong)((long)ppPVar10 - (long)ppPVar9 >> 3));
  }
  if (ppPVar10 != ppPVar9) {
    (this->list).super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppPVar9;
  }
  this->element = (PLYElement *)0x0;
  this->header_complete = false;
  poVar1 = &this->out;
  cVar7 = std::__basic_file<char>::is_open();
  if (cVar7 != '\0') {
    std::ofstream::close();
  }
  lVar5 = *(long *)(*(long *)poVar1 + -0x18);
  *(undefined4 *)(&this->field_0x64 + lVar5) = 5;
  std::ios::clear((int)poVar1 + (int)lVar5);
  iVar8 = std::ofstream::open((char *)poVar1,(_Ios_Openmode)__file);
  return iVar8;
}

Assistant:

void PLYWriter::open(const char *name, ply_encoding encoding)
{
  // set encoding

  if (encoding == ply_binary)
  {
    if (gutil::isMSBFirst())
    {
      encoding=ply_big_endian;
    }
    else
    {
      encoding=ply_little_endian;
    }
  }

  enc=encoding;

  // empty list, close file (if necessary) and open new file

  for (size_t i=0; i<list.size(); i++)
  {
    delete list[i];
  }

  list.clear();
  element=0;

  header_complete=false;

  if (out.is_open())
  {
    out.close();
  }

  out.exceptions(std::ios_base::failbit | std::ios_base::badbit);
  out.open(name, std::ios_base::binary);
}